

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O2

void __thiscall RenX_ChatLogPlugin::PrepFile(RenX_ChatLogPlugin *this)

{
  __type _Var1;
  char cVar2;
  char *pcVar3;
  ostream *poVar4;
  string current_date;
  string file_name;
  string full_date;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar3 = (char *)getTimeFormat("%F");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&current_date,pcVar3,(allocator<char> *)&full_date);
  pcVar3 = (char *)getTimeFormat("%c");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_date,pcVar3,(allocator<char> *)&file_name);
  _Var1 = std::operator==(&current_date,&this->last_date);
  if (!_Var1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->last_date,&current_date);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      std::fstream::close();
    }
    std::operator+(&local_30,"ChatLog_",&current_date);
    std::operator+(&file_name,&local_30,".log");
    std::__cxx11::string::~string((string *)&local_30);
    std::fstream::open((string *)&this->fs,(_Ios_Openmode)&file_name);
    poVar4 = std::operator<<((ostream *)&this->field_0xd0,"Session Start: ");
    poVar4 = std::operator<<(poVar4,(string *)&full_date);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&file_name);
  }
  std::__cxx11::string::~string((string *)&full_date);
  std::__cxx11::string::~string((string *)&current_date);
  return;
}

Assistant:

void RenX_ChatLogPlugin::PrepFile()
{
	// Check if date changed (Format: YYYY-MM-DD)
	std::string current_date = getTimeFormat("%F");
	std::string full_date = getTimeFormat("%c");

	if (current_date == last_date) {
		return;
	}

	last_date = current_date;

	// Close any currently opened file

	if (fs.is_open()) {
		fs.close();
	}

	// Open new file

	std::string file_name = "ChatLog_" + current_date + ".log";
	fs.open(file_name, std::fstream::out | std::fstream::app);

	fs << "Session Start: "
		<< full_date
		<< std::endl;
}